

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlWorker.cpp
# Opt level: O2

void __thiscall
adios2::query::XmlWorker::ConstructTree(XmlWorker *this,RangeTree *host,xml_node *node)

{
  string hint;
  string hint_00;
  string hint_01;
  bool bVar1;
  Relation RVar2;
  Op op;
  char_t *pcVar3;
  xml_node *pxVar4;
  undefined8 in_stack_fffffffffffffda8;
  vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_> *this_00;
  _Alloc_hider in_stack_fffffffffffffdb8;
  RangeTree subNode;
  string valStr;
  string opStr;
  xml_named_node_iterator __begin2;
  xml_node local_188 [4];
  xml_node local_168 [4];
  string local_148 [32];
  xml_node local_128 [4];
  string relationStr;
  string local_e8 [32];
  string local_c8 [32];
  xml_named_node_iterator __end2;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)local_128,"value",(allocator *)&valStr);
  std::__cxx11::string::string(local_148,"in query",(allocator *)&opStr);
  hint._M_string_length = (size_type)host;
  hint._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
  hint.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdb8._M_p;
  hint.field_2._8_8_ = node;
  helper::XMLAttribute((string *)&subNode,local_128,hint,SUB81(node,0));
  pcVar3 = pugi::xml_attribute::value((xml_attribute *)CONCAT44(subNode._4_4_,subNode.m_Relation));
  std::__cxx11::string::string((string *)&relationStr,pcVar3,(allocator *)&__begin2);
  std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::~unique_ptr
            ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)&subNode)
  ;
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::string((string *)&local_50,(string *)&relationStr);
  RVar2 = strToRelation(&local_50);
  host->m_Relation = RVar2;
  std::__cxx11::string::~string((string *)&local_50);
  pugi::xml_node::children((xml_object_range<pugi::xml_named_node_iterator> *)&subNode,node,"range")
  ;
  __begin2._name =
       (char_t *)
       subNode.m_Leaves.
       super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
       super__Vector_impl_data._M_finish;
  __begin2._parent._root =
       (xml_node_struct *)
       subNode.m_Leaves.
       super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
       super__Vector_impl_data._M_start;
  __end2._name = (char_t *)
                 subNode.m_SubNodes.
                 super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  __end2._wrap._root =
       (xml_node_struct *)
       subNode.m_Leaves.
       super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  __end2._parent._root =
       (xml_node_struct *)
       subNode.m_SubNodes.
       super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
       _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=(&__begin2,&__end2);
    if (!bVar1) break;
    pxVar4 = pugi::xml_named_node_iterator::operator*(&__begin2);
    std::__cxx11::string::string((string *)local_168,"value",(allocator *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::string(local_c8,"in query",(allocator *)&stack0xfffffffffffffdae);
    hint_00._M_string_length = (size_type)host;
    hint_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
    hint_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdb8._M_p;
    hint_00.field_2._8_8_ = node;
    helper::XMLAttribute(&opStr,local_168,hint_00,SUB81(pxVar4,0));
    pcVar3 = pugi::xml_attribute::value((xml_attribute *)opStr._M_dataplus._M_p);
    std::__cxx11::string::string((string *)&valStr,pcVar3,(allocator *)&stack0xfffffffffffffdad);
    std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::~unique_ptr
              ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)&opStr)
    ;
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::string
              ((string *)local_188,"compare",(allocator *)&stack0xfffffffffffffdae);
    std::__cxx11::string::string(local_e8,"in query",(allocator *)&stack0xfffffffffffffdad);
    hint_01._M_string_length = (size_type)host;
    hint_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
    hint_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdb8._M_p;
    hint_01.field_2._8_8_ = node;
    helper::XMLAttribute((string *)&stack0xfffffffffffffdb8,local_188,hint_01,SUB81(pxVar4,0));
    pcVar3 = pugi::xml_attribute::value((xml_attribute *)in_stack_fffffffffffffdb8._M_p);
    std::__cxx11::string::string((string *)&opStr,pcVar3,(allocator *)&stack0xfffffffffffffdaf);
    std::unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>::~unique_ptr
              ((unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_> *)
               &stack0xfffffffffffffdb8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::string((string *)&local_70,(string *)&opStr);
    op = strToQueryOp(&local_70);
    std::__cxx11::string::string((string *)&local_90,(string *)&valStr);
    RangeTree::AddLeaf(host,op,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&opStr);
    std::__cxx11::string::~string((string *)&valStr);
    pugi::xml_named_node_iterator::operator++(&__begin2);
  }
  pugi::xml_node::children((xml_object_range<pugi::xml_named_node_iterator> *)&valStr,node,"op");
  opStr.field_2._M_allocated_capacity = valStr.field_2._M_allocated_capacity;
  opStr._M_dataplus = valStr._M_dataplus;
  opStr._M_string_length = valStr._M_string_length;
  __begin2._wrap._root = (xml_node_struct *)valStr.field_2._8_8_;
  this_00 = &host->m_SubNodes;
  while( true ) {
    bVar1 = pugi::xml_named_node_iterator::operator!=((xml_named_node_iterator *)&opStr,&__begin2);
    if (!bVar1) break;
    pxVar4 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&opStr);
    subNode.m_Relation = AND;
    subNode.m_SubNodes.
    super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    subNode.m_SubNodes.
    super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subNode.m_Leaves.super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subNode.m_SubNodes.
    super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    subNode.m_Leaves.super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subNode.m_Leaves.super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ConstructTree(this,&subNode,pxVar4);
    std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::push_back
              (this_00,&subNode);
    RangeTree::~RangeTree(&subNode);
    pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&opStr);
  }
  std::__cxx11::string::~string((string *)&relationStr);
  return;
}

Assistant:

void XmlWorker::ConstructTree(RangeTree &host, const pugi::xml_node &node)
{
    std::string relationStr = adios2::helper::XMLAttribute("value", node, "in query")->value();
    host.SetRelation(adios2::query::strToRelation(relationStr));
    for (const pugi::xml_node &rangeNode : node.children("range"))
    {
        std::string valStr = adios2::helper::XMLAttribute("value", rangeNode, "in query")->value();
        std::string opStr = adios2::helper::XMLAttribute("compare", rangeNode, "in query")->value();

        host.AddLeaf(adios2::query::strToQueryOp(opStr), valStr);
    }

    for (const pugi::xml_node &opNode : node.children("op"))
    {
        adios2::query::RangeTree subNode;
        ConstructTree(subNode, opNode);
        host.AddNode(subNode);
    }
}